

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  unsigned_long *in_RDI;
  value_type_conflict5 *unaff_retaddr;
  size_type in_stack_00000008;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  BinaryBuffer *bb_00;
  undefined8 local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bb_00 = (BinaryBuffer *)0x0;
  Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)s,in_stack_00000008,
             unaff_retaddr);
  if (local_18 != 0) {
    Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,0);
    load<unsigned_long>(bb_00,in_RDI,0x217c5a);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }